

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O2

void boxcox_eval(double *x,int N,double lambda,double *bxcx)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  dVar3 = macheps();
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
  }
  uVar2 = 0;
  if (dVar3 / 744.44 <= ABS(lambda)) {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      dVar3 = log(x[uVar2]);
      dVar3 = expm1(dVar3 * lambda);
      bxcx[uVar2] = dVar3 / lambda;
    }
  }
  else {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      dVar3 = log(x[uVar2]);
      bxcx[uVar2] = dVar3;
    }
  }
  return;
}

Assistant:

void boxcox_eval(double *x, int N, double lambda,double *bxcx) {
    double eps;
    int i;

    eps = macheps() / 744.44;

    if (fabs(lambda) < eps) {
        for(i = 0; i < N;++i) {
            bxcx[i] = log(x[i]);
        }
    } else {
        for(i = 0; i < N;++i) {
            bxcx[i] = expm1(lambda * log(x[i])) / lambda;
        }
    }

}